

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O3

int __thiscall
glslang::TSymbolTableLevel::clone
          (TSymbolTableLevel *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *__str;
  ulong *puVar1;
  _Base_ptr p_Var2;
  int iVar3;
  int iVar4;
  TPoolAllocator *pTVar5;
  TSymbolTableLevel *pTVar6;
  long *plVar7;
  undefined8 *puVar8;
  TSymbol *pTVar9;
  basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *pbVar10;
  _Base_ptr p_Var11;
  const_iterator cVar12;
  long lVar13;
  pointer ppVar14;
  pointer ppVar15;
  long lVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  *s;
  allocator_type local_c9;
  TSymbolTableLevel *local_c8;
  pointer local_c0;
  TString local_b8;
  _Base_ptr local_90;
  _Rb_tree_node_base *local_88;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
  local_80;
  
  pTVar5 = GetThreadPoolAllocator();
  pTVar6 = (TSymbolTableLevel *)TPoolAllocator::allocate(pTVar5,0x68);
  pTVar5 = GetThreadPoolAllocator();
  (pTVar6->level)._M_t._M_impl.super__Node_allocator.allocator = pTVar5;
  local_90 = &(pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_header;
  (pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_90;
  (pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_90;
  (pTVar6->level)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar6->defaultPrecision = (TPrecisionQualifier *)0x0;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Tp_alloc_type.allocator = (TPoolAllocator *)0x0;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pTVar5 = GetThreadPoolAllocator();
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Tp_alloc_type.allocator = pTVar5;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pTVar6->retargetedSymbols).
  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  .
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined8 *)
   ((long)&(pTVar6->retargetedSymbols).
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 5) = 0;
  *(undefined8 *)
   ((long)&(pTVar6->retargetedSymbols).
           super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           .
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage + 5) = 0;
  iVar4 = this->anonId;
  pTVar6->anonId = iVar4;
  pTVar6->thisLevel = this->thisLevel;
  ppVar15 = (this->retargetedSymbols).
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVar14 = (this->retargetedSymbols).
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar15 != ppVar14) {
    do {
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_true>
                (&local_80,&ppVar15->first,&ppVar15->second);
      std::
      vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>>
      ::
      emplace_back<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>
                ((vector<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>,glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>,std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>>>>
                  *)&pTVar6->retargetedSymbols,&local_80);
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 != ppVar14);
    iVar4 = this->anonId;
  }
  local_b8._M_dataplus.super_allocator_type.allocator =
       local_b8._M_dataplus.super_allocator_type.allocator & 0xffffffffffffff00;
  local_c8 = pTVar6;
  std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&local_80,(long)iVar4,(bool *)&local_b8,
             &local_c9);
  p_Var11 = (this->level)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = &(this->level)._M_t._M_impl.super__Rb_tree_header._M_header;
  if (p_Var11 != local_88) {
    do {
      plVar7 = (long *)(**(code **)(*(long *)p_Var11[2]._M_parent + 0x58))();
      if (plVar7 == (long *)0x0) {
        __str = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (p_Var11 + 1);
        ppVar15 = (this->retargetedSymbols).
                  super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                  .
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_c0 = (this->retargetedSymbols).
                   super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                   .
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        lVar13 = (long)local_c0 - (long)ppVar15;
        lVar16 = (lVar13 >> 4) * -0x3333333333333333 >> 2;
        if (0 < lVar16) {
          lVar16 = lVar16 + 1;
          do {
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&ppVar15->first,__str);
            ppVar14 = ppVar15;
            if (iVar4 == 0) goto LAB_00356393;
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&ppVar15[1].first,__str);
            ppVar14 = ppVar15 + 1;
            if (iVar4 == 0) goto LAB_00356393;
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&ppVar15[2].first,__str);
            ppVar14 = ppVar15 + 2;
            if (iVar4 == 0) goto LAB_00356393;
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&ppVar15[3].first,__str);
            ppVar14 = ppVar15 + 3;
            if (iVar4 == 0) goto LAB_00356393;
            ppVar15 = ppVar15 + 4;
            lVar16 = lVar16 + -1;
            lVar13 = lVar13 + -0x140;
          } while (1 < lVar16);
        }
        lVar13 = (lVar13 >> 4) * -0x3333333333333333;
        if (lVar13 == 1) {
LAB_00356372:
          iVar4 = std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                  compare(&ppVar15->first,__str);
          ppVar14 = local_c0;
          if (iVar4 == 0) {
            ppVar14 = ppVar15;
          }
        }
        else {
          ppVar14 = ppVar15;
          if (lVar13 == 2) {
LAB_00356355:
            iVar4 = std::__cxx11::
                    basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                    compare(&ppVar14->first,__str);
            if (iVar4 != 0) {
              ppVar15 = ppVar14 + 1;
              goto LAB_00356372;
            }
          }
          else {
            ppVar14 = local_c0;
            if ((lVar13 == 3) &&
               (iVar4 = std::__cxx11::
                        basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                        compare(&ppVar15->first,__str), ppVar14 = ppVar15, iVar4 != 0)) {
              ppVar14 = ppVar15 + 1;
              goto LAB_00356355;
            }
          }
        }
LAB_00356393:
        if (ppVar14 ==
            (this->retargetedSymbols).
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          pTVar9 = (TSymbol *)(*(code *)**(undefined8 **)p_Var11[2]._M_parent)();
          local_b8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          insert(local_c8,pTVar9,false,&local_b8);
        }
      }
      else {
        iVar3 = (**(code **)(*plVar7 + 0xc0))(plVar7);
        iVar4 = iVar3 + 0x3f;
        if (-1 < iVar3) {
          iVar4 = iVar3;
        }
        if ((*(ulong *)((long)local_80.first._M_dataplus.super_allocator_type.allocator +
                       (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) * 8 +
                       (long)(iVar4 >> 6) * 8 + -8) >> ((long)iVar3 & 0x3fU) & 1) == 0) {
          puVar8 = (undefined8 *)(**(code **)(*plVar7 + 0xb0))(plVar7);
          pTVar9 = (TSymbol *)(**(code **)*puVar8)(puVar8);
          pTVar5 = GetThreadPoolAllocator();
          pbVar10 = (basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> *)
                    TPoolAllocator::allocate(pTVar5,0x28);
          pTVar5 = GetThreadPoolAllocator();
          *(TPoolAllocator **)pbVar10 = pTVar5;
          *(basic_string<char,std::char_traits<char>,glslang::std::allocator<char>> **)(pbVar10 + 8)
               = pbVar10 + 0x18;
          std::__cxx11::basic_string<char,std::char_traits<char>,glslang::std::allocator<char>>::
          _M_construct<char_const*>(pbVar10,"");
          (*pTVar9->_vptr_TSymbol[4])(pTVar9,pbVar10);
          local_b8._M_dataplus.super_allocator_type.allocator = GetThreadPoolAllocator();
          local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
          local_b8._M_string_length = 0;
          local_b8.field_2._M_local_buf[0] = '\0';
          insert(local_c8,pTVar9,false,&local_b8);
          iVar3 = (**(code **)(*plVar7 + 0xc0))(plVar7);
          iVar4 = iVar3 + 0x3f;
          if (-1 < iVar3) {
            iVar4 = iVar3;
          }
          puVar1 = (ulong *)((long)local_80.first._M_dataplus.super_allocator_type.allocator +
                            (ulong)(((long)iVar3 & 0x800000000000003fU) < 0x8000000000000001) * 8 +
                            (long)(iVar4 >> 6) * 8 + -8);
          *puVar1 = *puVar1 | 1L << ((byte)iVar3 & 0x3f);
        }
      }
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
    } while (p_Var11 != local_88);
  }
  p_Var2 = local_90;
  pTVar6 = local_c8;
  ppVar14 = (this->retargetedSymbols).
            super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            .
            super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar15 = (this->retargetedSymbols).
                 super_vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                 .
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar15 != ppVar14;
      ppVar15 = ppVar15 + 1) {
    cVar12 = std::
             _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
             ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>,_glslang::pool_allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::TSymbol_*>_>_>
                     *)pTVar6,&ppVar15->second);
    if ((cVar12._M_node != p_Var2) && ((TSymbol *)cVar12._M_node[2]._M_parent != (TSymbol *)0x0)) {
      insert(pTVar6,&ppVar15->first,(TSymbol *)cVar12._M_node[2]._M_parent);
    }
  }
  if (local_80.first._M_dataplus.super_allocator_type.allocator != (TPoolAllocator *)0x0) {
    operator_delete(local_80.first._M_dataplus.super_allocator_type.allocator,
                    local_80.first.field_2._8_8_ -
                    (long)local_80.first._M_dataplus.super_allocator_type.allocator);
  }
  return (int)pTVar6;
}

Assistant:

TSymbolTableLevel* TSymbolTableLevel::clone() const
{
    TSymbolTableLevel *symTableLevel = new TSymbolTableLevel();
    symTableLevel->anonId = anonId;
    symTableLevel->thisLevel = thisLevel;
    symTableLevel->retargetedSymbols.clear();
    for (auto &s : retargetedSymbols) {
        symTableLevel->retargetedSymbols.push_back({s.first, s.second});
    }
    std::vector<bool> containerCopied(anonId, false);
    tLevel::const_iterator iter;
    for (iter = level.begin(); iter != level.end(); ++iter) {
        const TAnonMember* anon = iter->second->getAsAnonMember();
        if (anon) {
            // Insert all the anonymous members of this same container at once,
            // avoid inserting the remaining members in the future, once this has been done,
            // allowing them to all be part of the same new container.
            if (! containerCopied[anon->getAnonId()]) {
                TVariable* container = anon->getAnonContainer().clone();
                container->changeName(NewPoolTString(""));
                // insert the container and all its members
                symTableLevel->insert(*container, false);
                containerCopied[anon->getAnonId()] = true;
            }
        } else {
            const TString& name = iter->first;
            auto retargetIter = std::find_if(retargetedSymbols.begin(), retargetedSymbols.end(),
                                          [&name](const std::pair<TString, TString>& i) { return i.first == name; });
            if (retargetIter != retargetedSymbols.end())
                continue;
            symTableLevel->insert(*iter->second->clone(), false);
        }
    }
    // Now point retargeted symbols to the newly created versions of them
    for (auto &s : retargetedSymbols) {
        TSymbol* sym = symTableLevel->find(s.second);
        if (!sym)
            continue;
        symTableLevel->insert(s.first, sym);
    }

    return symTableLevel;
}